

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::Draw
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,DrawAttribs *Attribs,int param_2)

{
  Uint32 *pUVar1;
  PRIMITIVE_TOPOLOGY Topology;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  Uint32 UVar4;
  GraphicsPipelineDesc *pGVar5;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char *in_R8;
  char (*in_R9) [8];
  PipelineStateGLImpl *pPVar6;
  string msg;
  string local_60;
  String local_40;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    CVar2 = (this->m_Desc).QueueType;
    if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&local_60,
                   (char (*) [79])
                   "Queue type may never be unknown for immediate contexts. This looks like a bug.")
        ;
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"Draw",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x8d8);
        std::__cxx11::string::~string((string *)&local_60);
      }
      FormatString<char[97]>
                (&local_60,
                 (char (*) [97])
                 "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8d8);
      std::__cxx11::string::~string((string *)&local_60);
      CVar2 = (this->m_Desc).QueueType;
      Type = extraout_DL;
    }
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_40,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[5],char[22],std::__cxx11::string,char[8]>
                (&local_60,(Diligent *)0x6f5f6e,(char (*) [5])0x7e8bba,(char (*) [22])&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_40);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8d8);
      std::__cxx11::string::~string((string *)&local_60);
    }
    pPVar6 = (this->m_pPipelineState).m_pObject;
    if (pPVar6 == (PipelineStateGLImpl *)0x0) {
      FormatString<char[64]>(&local_60,(char (*) [64])0x6f7a42);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8da);
      std::__cxx11::string::~string((string *)&local_60);
      pPVar6 = (this->m_pPipelineState).m_pObject;
    }
    PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
              (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if ((pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar6 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
                (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      FormatString<char[53],char_const*,char[30]>
                (&local_60,(Diligent *)0x6f7a87,
                 (char (*) [53])
                 &(pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a graphics pipeline.",(char (*) [30])in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8dd);
      std::__cxx11::string::~string((string *)&local_60);
    }
    bVar3 = VerifyDrawAttribs(Attribs);
    if (!bVar3) {
      FormatString<char[24]>(&local_60,(char (*) [24])0x6f7ac1);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Draw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x8df);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  pPVar6 = (this->m_pPipelineState).m_pObject;
  if (pPVar6 != (PipelineStateGLImpl *)0x0) {
    pGVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar6->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    Topology = pGVar5->PrimitiveTopology;
    UVar4 = GetPrimitiveCount(Topology,Attribs->NumVertices);
    pUVar1 = (this->m_Stats).PrimitiveCounts + Topology;
    *pUVar1 = *pUVar1 + UVar4;
  }
  pUVar1 = &(this->m_Stats).CommandCounters.Draw;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::Draw(const DrawAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "Draw");

        DEV_CHECK_ERR(m_pPipelineState, "Draw command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "Draw command arguments are invalid: pipeline state '", m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(VerifyDrawAttribs(Attribs), "DrawAttribs are invalid");
    }
#endif
    if (m_pPipelineState)
    {
        const PRIMITIVE_TOPOLOGY Topology = m_pPipelineState->GetGraphicsPipelineDesc().PrimitiveTopology;
        m_Stats.PrimitiveCounts[Topology] += GetPrimitiveCount(Topology, Attribs.NumVertices);
    }
    ++m_Stats.CommandCounters.Draw;
}